

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::RegexEs6MatchImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              bool noResult,void *stackAllocationPointer)

{
  bool bVar1;
  BOOL BVar2;
  Var pvVar3;
  RecyclableObject *instance;
  JavascriptString *matchStr;
  JavascriptArray *arr;
  BigIndex local_50;
  JavascriptString *local_40;
  JavascriptArray *local_38;
  
  bVar1 = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  if (bVar1) {
    JavascriptRegExp::GetUnicodeProperty(thisObj,scriptContext);
    JavascriptRegExp::SetLastIndexProperty(thisObj,&DAT_1000000000000,scriptContext);
    local_38 = (JavascriptArray *)0x0;
    local_40 = input;
    do {
      pvVar3 = JavascriptRegExp::CallExec
                         (thisObj,local_40,L"RegExp.prototype[Symbol.match]",scriptContext);
      BVar2 = JavascriptOperators::IsNull(pvVar3);
      if (BVar2 == 0) {
        instance = ExecResultToRecyclableObject(pvVar3);
        pvVar3 = JavascriptOperators::GetItem(instance,0,scriptContext);
        matchStr = JavascriptConversion::ToString(pvVar3,scriptContext);
        arr = local_38;
        if (local_38 == (JavascriptArray *)0x0) {
          arr = JavascriptLibrary::CreateArray
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary);
        }
        JavascriptArray::BigIndex::BigIndex(&local_50,(arr->super_ArrayObject).length);
        local_38 = arr;
        JavascriptArray::BigIndex::SetItem(&local_50,arr,matchStr);
        AdvanceLastIndex(thisObj,(JavascriptString *)arr,matchStr,false,scriptContext);
      }
    } while (BVar2 == 0);
    if (local_38 == (JavascriptArray *)0x0) {
      local_38 = (JavascriptArray *)
                 (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nullValue.ptr;
    }
    return local_38;
  }
  pvVar3 = JavascriptRegExp::CallExec(thisObj,input,L"RegExp.prototype[Symbol.match]",scriptContext)
  ;
  return pvVar3;
}

Assistant:

Var RegexHelper::RegexEs6MatchImpl(ScriptContext* scriptContext, RecyclableObject *thisObj, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        PCWSTR const varName = _u("RegExp.prototype[Symbol.match]");

        if (!JavascriptRegExp::GetGlobalProperty(thisObj, scriptContext))
        {
            return JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
        }
        else
        {
            bool unicode = JavascriptRegExp::GetUnicodeProperty(thisObj, scriptContext);

            JavascriptRegExp::SetLastIndexProperty(thisObj, TaggedInt::ToVarUnchecked(0), scriptContext);

            JavascriptArray* arrayResult = nullptr;

            do
            {
                Var result = JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
                if (JavascriptOperators::IsNull(result))
                {
                    break;
                }

                RecyclableObject* resultObj = ExecResultToRecyclableObject(result);
                JavascriptString* matchStr = GetMatchStrFromResult(resultObj, scriptContext);

                if (arrayResult == nullptr)
                {
                    arrayResult = scriptContext->GetLibrary()->CreateArray();
                }

                arrayResult->DirectAppendItem(matchStr);

                AdvanceLastIndex(thisObj, input, matchStr, unicode, scriptContext);
            }
            while (true);

            return arrayResult != nullptr
                ? arrayResult
                : scriptContext->GetLibrary()->GetNull();
        }
    }